

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::import_generator<flatbuffers::StructDef>
          (DartGenerator *this,
          vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *definitions,
          string *included,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *imports)

{
  size_type sVar1;
  __type _Var2;
  pointer ppSVar3;
  string component;
  string filename;
  string filebase;
  allocator<char> local_172;
  allocator<char> local_171;
  string *local_170;
  Namer *local_168;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_160;
  pointer local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = (definitions->
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_168 = &(this->namer_).super_Namer;
  local_170 = included;
  local_160 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)imports;
  for (ppSVar3 = (definitions->
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppSVar3 != local_158;
      ppSVar3 = ppSVar3 + 1) {
    _Var2 = std::operator==(&((*ppSVar3)->super_Definition).file,included);
    if (_Var2) {
      (*((Namer *)&local_168->_vptr_Namer)->_vptr_Namer[10])
                (&local_150,local_168,((*ppSVar3)->super_Definition).defined_namespace);
      StripExtension(&local_130,&((*ppSVar3)->super_Definition).file);
      StripPath(&local_d0,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if (local_150._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_171);
      }
      else {
        std::operator+(&local_f0,"_",&local_150);
      }
      std::operator+(&local_50,&local_d0,&local_f0);
      Namer::File(&local_130,local_168,&local_50,None);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_f0);
      std::operator+(&local_70,"import \'./",&local_130);
      std::operator+(&local_f0,&local_70,"\'");
      sVar1 = local_150._M_string_length;
      if (local_150._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,";\n",&local_172);
      }
      else {
        ImportAliasName(&local_b0,&local_150);
        std::operator+(&local_90," as ",&local_b0);
        std::operator+(&local_110,&local_90,";\n");
      }
      std::operator+(&local_50,&local_f0,&local_110);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string>(local_160,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_110);
      if (sVar1 != 0) {
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      included = local_170;
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  return;
}

Assistant:

void import_generator(const std::vector<T *> &definitions,
                        const std::string &included,
                        std::set<std::string> &imports) {
    for (const auto &item : definitions) {
      if (item->file == included) {
        std::string component = namer_.Namespace(*item->defined_namespace);
        std::string filebase =
            flatbuffers::StripPath(flatbuffers::StripExtension(item->file));
        std::string filename =
            namer_.File(filebase + (component.empty() ? "" : "_" + component));

        imports.emplace("import './" + filename + "'" +
                        (component.empty()
                             ? ";\n"
                             : " as " + ImportAliasName(component) + ";\n"));
      }
    }
  }